

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_util_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::
BufferUtilTest_test_hex_buffer_with_empty_string_create_an_empty_buffer_Test::TestBody
          (BufferUtilTest_test_hex_buffer_with_empty_string_create_an_empty_buffer_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_a8;
  Message local_a0 [3];
  allocator<char> local_81;
  string local_80 [32];
  string local_60 [48];
  undefined8 local_30;
  undefined4 local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  BufferUtilTest_test_hex_buffer_with_empty_string_create_an_empty_buffer_Test *this_local;
  
  local_24 = 0;
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80,"",&local_81);
  bidfx_public_api::tools::BufferUtil::HexBuffer(local_60);
  local_30 = bidfx_public_api::tools::ByteBuffer::ReadableBytes();
  testing::internal::EqHelper<true>::Compare<int,unsigned_long>
            (local_20,"0",(int *)"BufferUtil::HexBuffer(\"\").ReadableBytes()",
             (unsigned_long *)&local_24,&local_30);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)local_60);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_a0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/buffer_util_test.cpp"
               ,0x18,message);
    testing::internal::AssertHelper::operator=(&local_a8,local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(BufferUtilTest, test_hex_buffer_with_empty_string_create_an_empty_buffer)
{
    ASSERT_EQ(0, BufferUtil::HexBuffer("").ReadableBytes());
}